

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

bool anon_unknown.dwarf_39603::DecodeBase64
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *in)

{
  FILE *pFVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  uchar *out_00;
  size_type max_out;
  uint8_t *in_00;
  size_type local_28;
  size_t len;
  string *in_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  len = (size_t)in;
  in_local = (string *)out;
  sVar3 = std::__cxx11::string::size();
  iVar2 = EVP_DecodedLength(&local_28,sVar3);
  pFVar1 = _stderr;
  if (iVar2 == 0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Invalid base64: %s.\n",uVar4);
    out_local._7_1_ = false;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_local,local_28);
    out_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_local);
    max_out = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_local);
    in_00 = (uint8_t *)std::__cxx11::string::data();
    sVar3 = std::__cxx11::string::size();
    iVar2 = EVP_DecodeBase64(out_00,&local_28,max_out,in_00,sVar3);
    pFVar1 = _stderr;
    if (iVar2 == 0) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"Invalid base64: %s.\n",uVar4);
      out_local._7_1_ = false;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_local,local_28);
      out_local._7_1_ = true;
    }
  }
  return out_local._7_1_;
}

Assistant:

bool DecodeBase64(std::vector<uint8_t> *out, const std::string &in) {
  size_t len;
  if (!EVP_DecodedLength(&len, in.size())) {
    fprintf(stderr, "Invalid base64: %s.\n", in.c_str());
    return false;
  }
  out->resize(len);
  if (!EVP_DecodeBase64(out->data(), &len, out->size(),
                        reinterpret_cast<const uint8_t *>(in.data()),
                        in.size())) {
    fprintf(stderr, "Invalid base64: %s.\n", in.c_str());
    return false;
  }
  out->resize(len);
  return true;
}